

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::VerifyIntSpecForIgnoringIntOverflow(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  JITTimeFunctionBody *this_00;
  char16 *pcVar7;
  char16 *pcVar8;
  undefined8 uVar9;
  RejitException *this_01;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  Instr *instr_local;
  GlobOpt *this_local;
  
  if ((*(uint *)&this->field_0xf4 >> 1 & 1) != 0) {
    return;
  }
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    return;
  }
  if ((instr->m_opcode == Mul_I4) &&
     (((instr->m_opcode != Mul_I4 || (bVar2 = IR::Instr::ShouldCheckFor32BitOverflow(instr), bVar2))
      || (bVar2 = IR::Instr::ShouldCheckForNon32BitOverflow(instr), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x37db,
                       "(instr->m_opcode != Js::OpCode::Mul_I4 || (instr->m_opcode == Js::OpCode::Mul_I4 && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow() ))"
                       ,
                       "instr->m_opcode != Js::OpCode::Mul_I4 || (instr->m_opcode == Js::OpCode::Mul_I4 && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow() )"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr->m_opcode == Ld_A) {
    return;
  }
  bVar2 = IR::Instr::HasBailOutInfo(instr);
  if ((!bVar2) || (instr->m_opcode == Mul_I4)) {
    pOVar6 = IR::Instr::GetDst(instr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetDst(instr);
      bVar2 = IR::Opnd::IsInt32(pOVar6);
      if (!bVar2) goto LAB_005892dd;
    }
    pOVar6 = IR::Instr::GetSrc1(instr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar2 = IR::Opnd::IsInt32(pOVar6);
      if (!bVar2) goto LAB_005892dd;
    }
    pOVar6 = IR::Instr::GetSrc2(instr);
    if (pOVar6 == (Opnd *)0x0) {
      return;
    }
    pOVar6 = IR::Instr::GetSrc2(instr);
    bVar2 = IR::Opnd::IsInt32(pOVar6);
    if (bVar2) {
      return;
    }
  }
LAB_005892dd:
  bVar2 = IR::Instr::HasBailOutInfo(instr);
  if ((!bVar2) && (bVar2 = IR::Instr::HasAnySideEffects(instr), !bVar2)) {
    return;
  }
  bVar2 = Func::IsTrackCompoundedIntOverflowDisabled(this->func);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x37f3,"(!func->IsTrackCompoundedIntOverflowDisabled())",
                       "!func->IsTrackCompoundedIntOverflowDisabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = Func::GetSourceContextId(this->func);
  uVar4 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar3,uVar4);
  if (bVar2) {
    this_00 = Func::GetJITFunctionBody(this->func);
    pcVar7 = JITTimeFunctionBody::GetDisplayName(this_00);
    pcVar8 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_78);
    Output::Print(L"BailOut (compile-time): function: %s (%s) instr: ",pcVar7,pcVar8);
    IR::Instr::Dump(instr);
    Output::Print(L"(overflow does not matter but could not int-spec or needed bailout)\n");
    Output::Flush();
  }
  bVar2 = Func::IsTrackCompoundedIntOverflowDisabled(this->func);
  if (!bVar2) {
    this_01 = (RejitException *)__cxa_allocate_exception(1);
    Js::RejitException::RejitException(this_01,TrackIntOverflowDisabled);
    __cxa_throw(this_01,&Js::RejitException::typeinfo,0);
  }
  uVar3 = Func::GetSourceContextId(this->func);
  uVar4 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar3,uVar4);
  if (bVar2) {
    Output::Print(L"    Aborting JIT because TrackIntOverflow is already off\n");
    Output::Flush();
  }
  uVar9 = __cxa_allocate_exception(1);
  __cxa_throw(uVar9,&Js::OperationAbortedException::typeinfo,0);
}

Assistant:

void
GlobOpt::VerifyIntSpecForIgnoringIntOverflow(IR::Instr *const instr)
{
    if(intOverflowCurrentlyMattersInRange || IsLoopPrePass())
    {
        return;
    }

    Assert(instr->m_opcode != Js::OpCode::Mul_I4 ||
        (instr->m_opcode == Js::OpCode::Mul_I4 && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow() ));

    // Instructions that are marked as "overflow doesn't matter" in the range must guarantee that they operate on int values and
    // result in int values, for ignoring overflow to be valid. So, int-specialization is required for such instructions in the
    // range. Ld_A is an exception because it only specializes if the src sym is available as a required specialized sym, and it
    // doesn't generate bailouts or cause ignoring int overflow to be invalid.
    // MULs are allowed to start a region and have BailOutInfo since they will bailout on non-32 bit overflow.
    if(instr->m_opcode == Js::OpCode::Ld_A ||
       ((!instr->HasBailOutInfo() || instr->m_opcode == Js::OpCode::Mul_I4) &&
        (!instr->GetDst() || instr->GetDst()->IsInt32()) &&
        (!instr->GetSrc1() || instr->GetSrc1()->IsInt32()) &&
        (!instr->GetSrc2() || instr->GetSrc2()->IsInt32())))
    {
        return;
    }

    if (!instr->HasBailOutInfo() && !instr->HasAnySideEffects())
    {
        return;
    }

    // This can happen for Neg_A if it needs to bail out on negative zero, and perhaps other cases as well. It's too late to fix
    // the problem (overflows may already be ignored), so handle it by bailing out at compile-time and disabling tracking int
    // overflow.
    Assert(!func->IsTrackCompoundedIntOverflowDisabled());

    if(PHASE_TRACE(Js::BailOutPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("BailOut (compile-time): function: %s (%s) instr: "),
            func->GetJITFunctionBody()->GetDisplayName(),
            func->GetDebugNumberSet(debugStringBuffer));
#if DBG_DUMP
        instr->Dump();
#else
        Output::Print(_u("%s "), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
#endif
        Output::Print(_u("(overflow does not matter but could not int-spec or needed bailout)\n"));
        Output::Flush();
    }

    if(func->IsTrackCompoundedIntOverflowDisabled())
    {
        // Tracking int overflows is already off for some reason. Prevent trying to rejit again because it won't help and the
        // same thing will happen again and cause an infinite loop. Just abort jitting this function.
        if(PHASE_TRACE(Js::BailOutPhase, this->func))
        {
            Output::Print(_u("    Aborting JIT because TrackIntOverflow is already off\n"));
            Output::Flush();
        }
        throw Js::OperationAbortedException();
    }

    throw Js::RejitException(RejitReason::TrackIntOverflowDisabled);
}